

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

WhereInfo *
sqlite3WhereBegin(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,
                 ExprList *pDistinct,u16 wctrlFlags,int iIdxCur)

{
  WhereLevel *pWVar1;
  uint *__s;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  Vdbe *pVVar5;
  sqlite3 *db;
  Table *pTVar6;
  VTable *zP4;
  Vdbe *p;
  Op *pOVar7;
  Parse *pParse_00;
  SrcList *pSVar8;
  WhereClause *pWVar9;
  sqlite3_index_info *psVar10;
  sqlite3_index_constraint_usage *psVar11;
  sqlite3_index_constraint *psVar12;
  tRowcnt *ptVar13;
  SrcList *pSVar14;
  uint uVar15;
  undefined4 uVar16;
  undefined8 zAff;
  char cVar17;
  u8 uVar18;
  u16 uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int p3;
  WhereInfo *pWInfo;
  WhereTerm *pWVar25;
  KeyInfo *pKVar26;
  Vdbe *p_00;
  Index *pIVar27;
  CollSeq *pCVar28;
  int *piVar29;
  WhereTerm *pWVar30;
  char *pcVar31;
  SrcList *pSVar32;
  Expr *pEVar33;
  Expr *pEVar34;
  WhereInfo *pWInfo_00;
  int iVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  Schema **ppSVar40;
  byte *pbVar41;
  uint n;
  long lVar42;
  ulong uVar43;
  WhereTerm *pWVar44;
  int iVar45;
  int iVar46;
  SrcList_item *pSVar47;
  Expr *pEVar48;
  SrcList_item *pSVar49;
  SrcList *pSVar50;
  byte *pbVar51;
  WhereLevel *pWVar52;
  byte bVar53;
  uint uVar54;
  int iVar55;
  uint p2;
  ulong uVar56;
  int p4;
  ulong uVar57;
  u8 *puVar58;
  int iVar59;
  bool bVar60;
  bool bVar61;
  byte bVar62;
  char *zStartAff;
  double local_1d8;
  ulong local_1c8;
  ulong local_1b8;
  WhereTerm *local_1b0;
  SrcList *local_1a0;
  Index *local_188;
  double local_178;
  uint local_16c;
  ulong local_160;
  WhereTerm *local_158;
  anon_union_8_3_b4c78fbb_for_u local_140;
  WhereBestIdx local_f8;
  Expr local_78;
  
  bVar62 = 0;
  pVVar5 = pParse->pVdbe;
  local_f8.pWC = (WhereClause *)0x0;
  local_f8.cost.plan.u.pIdx = (Index *)0x0;
  local_f8.cost.rCost = 0.0;
  local_f8.cost.plan.wsFlags = 0;
  local_f8.cost.plan.nEq = 0;
  local_f8.cost.plan.nOBSat = 0;
  local_f8.cost.plan.nRow = 0.0;
  local_f8.i = 0;
  local_f8.n = 0;
  local_f8.aLevel = (WhereLevel *)0x0;
  local_f8.pDistinct = (ExprList *)0x0;
  local_f8.ppIdxInfo = (sqlite3_index_info **)0x0;
  local_f8.notValid = 0;
  local_f8.pOrderBy = (ExprList *)0x0;
  local_f8.pSrc = (SrcList_item *)0x0;
  local_f8.notReady = 0;
  local_f8.cost.used = 0;
  local_f8.pParse = pParse;
  if (0x40 < pTabList->nSrc) {
    sqlite3ErrorMsg(pParse,"at most %d tables in a join",0x40);
    return (WhereInfo *)0x0;
  }
  uVar15 = (int)pTabList->nSrc;
  if ((wctrlFlags & 0x40) != 0) {
    uVar15 = 1;
  }
  db = pParse->db;
  uVar57 = (long)(int)(uVar15 * 0x60 + 0x47) & 0xffffffffffffffe0;
  iVar45 = (int)uVar57 + 0x2f4;
  pWInfo = (WhereInfo *)sqlite3DbMallocRaw(db,iVar45);
  if (pWInfo != (WhereInfo *)0x0) {
    memset(pWInfo,0,(long)iVar45);
  }
  if (db->mallocFailed != '\0') {
    sqlite3DbFree(db,pWInfo);
    pWInfo = (WhereInfo *)0x0;
    goto LAB_0016141c;
  }
  pWInfo->nLevel = uVar15;
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  iVar45 = sqlite3VdbeMakeLabel(pVVar5);
  pWInfo->iBreak = iVar45;
  pWVar9 = (WhereClause *)((long)pWInfo->a + (uVar57 - 0x40));
  pWInfo->pWC = pWVar9;
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  __s = (uint *)((long)pWInfo[3].a + (uVar57 - 0x30));
  pWVar1 = pWInfo->a;
  if ((db->dbOptFlags & 0x20) != 0) {
    pDistinct = (ExprList *)0x0;
  }
  local_f8.pWC = pWVar9;
  local_f8.aLevel = pWVar1;
  memset(__s,0,0x104);
  *(Parse **)((long)pWInfo->a + (uVar57 - 0x40)) = pParse;
  *(uint **)((long)pWInfo->a + (uVar57 - 0x38)) = __s;
  *(undefined8 *)((long)pWInfo->a + (uVar57 - 0x30)) = 0;
  *(undefined8 *)((long)pWInfo->a + (uVar57 - 0x24)) = 0x800000000;
  *(ulong *)((long)pWInfo->a + (uVar57 - 0x18)) = (long)pWInfo->a + (uVar57 - 0x10);
  *(u16 *)((long)pWInfo->a + (uVar57 - 0x26)) = wctrlFlags;
  if ((pParse->cookieGoto == 0) && ((pParse->db->dbOptFlags & 8) == 0)) {
    local_78.u.zToken = (char *)0x0;
    local_78.pRight = (Expr *)0x0;
    local_78.x.pList = (ExprList *)0x0;
    local_78._0_8_ = evalConstExpr;
    local_78.pLeft = (Expr *)pParse;
    sqlite3WalkExpr((Walker *)&local_78,pWhere);
  }
  whereSplit(pWVar9,pWhere,0x45);
  uVar57 = extraout_RDX;
  if (pWhere != (Expr *)0x0) {
    if (uVar15 != 0) {
      local_78.pLeft = (Expr *)0x0;
      local_78.pRight = (Expr *)0x0;
      local_78.x = (anon_union_8_2_a01b6dbf_for_x)0x3;
      local_78._0_8_ = exprNodeIsConstant;
      local_78.u.zToken = (char *)selectNodeIsConstant;
      sqlite3WalkExpr((Walker *)&local_78,pWhere);
      uVar57 = extraout_RDX_00;
      if (local_78.x._0_4_ == 0) goto LAB_001613b2;
    }
    sqlite3ExprIfFalse(pParse,pWhere,pWInfo->iBreak,8);
    uVar57 = extraout_RDX_01;
  }
LAB_001613b2:
  sVar2 = pTabList->nSrc;
  if (0 < (long)sVar2) {
    lVar36 = 0;
    do {
      uVar54 = *(uint *)((long)&pTabList->a[0].iCursor + lVar36);
      uVar57 = (ulong)uVar54;
      iVar45 = *(int *)&pWVar9[1].pParse;
      *(int *)&pWVar9[1].pParse = iVar45 + 1;
      *(uint *)((long)pWVar9[1].aStatic + (long)iVar45 * 4 + -0x2c) = uVar54;
      lVar36 = lVar36 + 0x68;
    } while ((long)sVar2 * 0x68 - lVar36 != 0);
  }
  if (0 < pWVar9->nTerm) {
    iVar45 = pWVar9->nTerm + 1;
    do {
      exprAnalyze((SrcList *)pWVar9,(WhereClause *)(ulong)(iVar45 - 2),(int)uVar57);
      iVar45 = iVar45 + -1;
      uVar57 = extraout_RDX_02;
    } while (1 < iVar45);
  }
  if (db->mallocFailed != '\0') goto LAB_0016141c;
  if (pDistinct == (ExprList *)0x0) {
    pDistinct = (ExprList *)0x0;
  }
  else if (pTabList->nSrc == 1) {
    iVar45 = pTabList->a[0].iCursor;
    pTVar6 = pTabList->a[0].pTab;
    if (0 < (long)pDistinct->nExpr) {
      lVar36 = 0;
      do {
        for (pEVar34 = pDistinct->a[lVar36].pExpr;
            (pEVar34 != (Expr *)0x0 && ((pEVar34->op == '\\' || (pEVar34->op == '\x18'))));
            pEVar34 = pEVar34->pLeft) {
        }
        if (((pEVar34->op == 0x98) && (pEVar34->iTable == iVar45)) && (pEVar34->iColumn < 0))
        goto LAB_001615c2;
        lVar36 = lVar36 + 1;
      } while (lVar36 != pDistinct->nExpr);
    }
    for (pIVar27 = pTVar6->pIndex; pIVar27 != (Index *)0x0; pIVar27 = pIVar27->pNext) {
      if (pIVar27->onError != '\0') {
        if (pIVar27->nColumn == 0) {
          uVar54 = 0;
        }
        else {
          uVar57 = 0;
          do {
            pWVar25 = findTerm(pWVar9,iVar45,pIVar27->aiColumn[uVar57],0xffffffffffffffff,2,pIVar27)
            ;
            if (pWVar25 == (WhereTerm *)0x0) {
              iVar20 = findIndexCol(pParse,pDistinct,iVar45,pIVar27,(int)uVar57);
              if (iVar20 < 0) {
                bVar60 = true;
                bVar61 = false;
              }
              else {
                bVar60 = pTVar6->aCol[pIVar27->aiColumn[uVar57]].notNull == '\0';
                bVar61 = !bVar60;
              }
              if (bVar61) goto LAB_0016156e;
            }
            else {
LAB_0016156e:
              bVar60 = false;
            }
          } while ((!bVar60) && (uVar57 = uVar57 + 1, uVar57 < pIVar27->nColumn));
          uVar54 = (uint)uVar57;
        }
        if (uVar54 == pIVar27->nColumn) goto LAB_001615c2;
      }
    }
  }
LAB_001615d2:
  local_f8.notValid = 0xffffffffffffffff;
  local_f8._64_8_ = (ulong)uVar15 << 0x20;
  pWVar52 = pWVar1;
  local_f8.pOrderBy = pOrderBy;
  local_f8.pDistinct = pDistinct;
  if ((int)uVar15 < 1) {
    bVar53 = 1;
  }
  else {
    uVar54 = 0xffffffff;
    uVar24 = 0;
    do {
      if (uVar24 == uVar15 - 1) {
        iVar45 = 0;
      }
      else {
        local_f8.pSrc = pTabList->a + (int)uVar24;
        iVar45 = -1;
        if ((int)uVar24 < (int)uVar15) {
          uVar39 = uVar24;
          do {
            if (0 < (int)*__s) {
              uVar57 = 0;
              do {
                if (*(int *)((long)pWVar9[1].aStatic + uVar57 * 4 + -0x2c) ==
                    (local_f8.pSrc)->iCursor) {
                  uVar57 = 1L << ((byte)uVar57 & 0x3f);
                  goto LAB_00161698;
                }
                uVar57 = uVar57 + 1;
              } while (*__s != uVar57);
            }
            uVar57 = 0;
LAB_00161698:
            if ((local_f8.notValid & uVar57) == 0) {
              uVar24 = uVar24 + (uVar39 == uVar24);
            }
            else {
              if (((int)uVar24 < (int)uVar39) && (((local_f8.pSrc)->jointype & 10) != 0)) break;
              if (iVar45 != -1) {
                iVar45 = 1;
                break;
              }
              iVar45 = 0;
              if (((local_f8.pSrc)->jointype & 8) != 0) break;
            }
            uVar39 = uVar39 + 1;
            local_f8.pSrc = local_f8.pSrc + 1;
          } while (uVar39 != uVar15);
        }
      }
      if (iVar45 < 0) {
        iVar20 = -1;
        local_178 = 0.0;
        local_1c8 = 0;
        local_160._0_2_ = 0;
        uVar3 = 0;
        local_140.pIdx = (Index *)0x0;
      }
      else {
        lVar36 = (long)(int)uVar24;
        local_178 = 0.0;
        iVar20 = -1;
        iVar59 = 0;
        local_1d8 = 1e+99;
        local_140.pIdx = (Index *)0x0;
        uVar3 = 0;
        local_160 = 0;
        local_1c8 = 0;
        iVar55 = iVar45;
        do {
          local_f8.pSrc = pTabList->a + lVar36;
          lVar42 = lVar36;
          if ((int)uVar24 < (int)uVar15) {
            do {
              if ((lVar36 < lVar42) && (((local_f8.pSrc)->jointype & 10) != 0)) break;
              if (0 < (long)(int)*__s) {
                lVar37 = 0;
                do {
                  if (*(int *)((long)pWVar9[1].aStatic + lVar37 * 4 + -0x2c) ==
                      (local_f8.pSrc)->iCursor) {
                    uVar57 = 1L << ((byte)lVar37 & 0x3f);
                    goto LAB_001617b1;
                  }
                  lVar37 = lVar37 + 1;
                } while ((int)*__s != lVar37);
              }
              uVar57 = 0;
LAB_001617b1:
              if ((local_f8.notValid & uVar57) != 0) {
                local_f8.notReady = uVar57;
                if (iVar55 == 0) {
                  local_f8.notReady = local_f8.notValid;
                }
                iVar59 = iVar59 + (uint)((local_f8.pSrc)->pIndex == (Index *)0x0);
                if (((local_f8.pSrc)->pTab->tabFlags & 0x10) == 0) {
                  bestBtreeIndex(&local_f8);
                }
                else {
                  local_f8.ppIdxInfo = &pWVar1[lVar42].pIdxInfo;
                  bestVirtualIndex(&local_f8);
                }
                if (iVar55 == 0) {
                  if (iVar45 != 0) {
                    local_f8.cost.rCost = local_f8.cost.rCost / pWInfo->a[lVar42].rOptCost;
                  }
                }
                else {
                  pWInfo->a[lVar42].rOptCost = local_f8.cost.rCost;
                }
                if ((((local_f8.cost.used & local_f8.notValid) == 0) &&
                    (((iVar59 == 0 || ((local_f8.pSrc)->pIndex == (Index *)0x0)) ||
                     ((local_f8.cost.plan._0_8_ & 0x100f3000) != 0)))) &&
                   (((iVar20 < 0 || (local_f8.cost.rCost < local_1d8)) ||
                    ((local_f8.cost.rCost <= local_1d8 &&
                     ((uVar3 < local_f8.cost.plan.nOBSat || (local_f8.cost.plan.nRow < local_178))))
                    )))) {
                  local_1c8 = local_f8.cost.plan._0_8_ & 0xffffffff;
                  local_160 = (ulong)local_f8.cost.plan._0_8_ >> 0x20 & 0xffff;
                  local_178 = local_f8.cost.plan.nRow;
                  local_140 = local_f8.cost.plan.u;
                  local_1d8 = local_f8.cost.rCost;
                  iVar20 = (int)lVar42;
                  uVar3 = local_f8.cost.plan.nOBSat;
                }
                if (((local_f8.pSrc)->jointype & 8) != 0) break;
              }
              lVar42 = lVar42 + 1;
              local_f8.pSrc = local_f8.pSrc + 1;
            } while (uVar15 != (uint)lVar42);
          }
        } while ((0 < iVar55) && (iVar55 = iVar55 + -1, iVar20 < 0));
      }
      if (((uint)local_1c8 >> 0x1e & 1) != 0) {
        pWInfo->eDistinct = '\x02';
      }
      (pWVar52->plan).wsFlags = (uint)local_1c8;
      (pWVar52->plan).nEq = (u16)local_160;
      (pWVar52->plan).nOBSat = uVar3;
      (pWVar52->plan).nRow = local_178;
      (pWVar52->plan).u.pIdx = (Index *)local_140;
      iVar45 = pTabList->a[iVar20].iCursor;
      pWVar52->iTabCur = iVar45;
      if ((local_1c8 & 0x200f0000) == 0) {
        iVar55 = -1;
      }
      else if (((wctrlFlags & 0x40) == 0) || (iVar55 = iIdxCur, (local_1c8 & 0x20000000) != 0)) {
        iVar55 = pParse->nTab;
        pParse->nTab = iVar55 + 1;
      }
      pWVar52->iIdxCur = iVar55;
      uVar57 = 0xffffffffffffffff;
      if (0 < (long)(int)*__s) {
        lVar36 = 0;
        do {
          if (*(int *)((long)pWVar9[1].aStatic + lVar36 * 4 + -0x2c) == iVar45) {
            bVar53 = (byte)lVar36 & 0x3f;
            uVar57 = -2L << bVar53 | 0xfffffffffffffffeU >> 0x40 - bVar53;
            break;
          }
          lVar36 = lVar36 + 1;
        } while ((int)*__s != lVar36);
      }
      local_f8.notValid = local_f8.notValid & uVar57;
      pWVar52->iFrom = (u8)iVar20;
      if (1.0 <= local_178) {
        pParse->nQueryLoop = local_178 * pParse->nQueryLoop;
      }
      pIVar27 = pTabList->a[iVar20].pIndex;
      if ((pIVar27 != (Index *)0x0) && ((local_1c8 & 0xf0000) == 0)) {
        sqlite3ErrorMsg(pParse,"cannot use index: %s",pIVar27->zName);
        goto LAB_0016141c;
      }
      uVar54 = uVar54 & (uint)local_1c8;
      iVar45 = local_f8.i + 1;
      local_f8.i = iVar45;
      pWVar52 = pWVar52 + 1;
    } while (iVar45 < (int)uVar15);
    bVar53 = (byte)(uVar54 >> 0x19) & 1;
  }
  if ((pParse->nErr == 0) && (db->mallocFailed == '\0')) {
    if (uVar15 == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = *(u16 *)((long)(pWVar52 + -1) + 6);
    }
    pWInfo->nOBSat = uVar19;
    if (pOrderBy != (ExprList *)0x0 && (bVar53 ^ 1) == 0) {
      pWInfo->nOBSat = (u16)pOrderBy->nExpr;
    }
    if ((wctrlFlags & 4) != 0 && (bVar53 ^ 1) == 0) {
      pWInfo->okOnePass = '\x01';
      pbVar41 = (byte *)((long)&pWInfo->a[0].plan.wsFlags + 2);
      *pbVar41 = *pbVar41 & 0xbf;
    }
    sqlite3CodeVerifySchema(pParse,-1);
    pWInfo->nRowOut = 1.0;
    if (0 < (int)uVar15) {
      uVar54 = 0;
      local_1b8 = 0xffffffffffffffff;
      pWVar52 = pWVar1;
      do {
        bVar53 = pWVar52->iFrom;
        pTVar6 = pTabList->a[bVar53].pTab;
        pWInfo->nRowOut = (pWVar52->plan).nRow * pWInfo->nRowOut;
        if (pTVar6->pSchema == (Schema *)0x0) {
          uVar57 = 0xfff0bdc0;
        }
        else {
          uVar24 = db->nDb;
          if ((int)uVar24 < 1) {
            uVar57 = 0;
          }
          else {
            ppSVar40 = &db->aDb->pSchema;
            uVar57 = 0;
            do {
              if (*ppSVar40 == pTVar6->pSchema) goto LAB_00161ca6;
              uVar57 = uVar57 + 1;
              ppSVar40 = ppSVar40 + 4;
            } while (uVar24 != uVar57);
            uVar57 = (ulong)uVar24;
          }
        }
LAB_00161ca6:
        pSVar47 = pTabList->a + bVar53;
        iVar45 = (int)uVar57;
        if (((pTVar6->tabFlags & 2) == 0) && (pTVar6->pSelect == (Select *)0x0)) {
          uVar24 = (pWVar52->plan).wsFlags;
          if ((uVar24 >> 0x1b & 1) == 0) {
            if ((pTVar6->tabFlags & 0x10) == 0) {
              if ((uVar24 & 0x400000) == 0 && (wctrlFlags & 0x10) == 0) {
                sqlite3OpenTable(pParse,pSVar47->iCursor,iVar45,pTVar6,
                                 0x28 - (uint)(pWInfo->okOnePass == '\0'));
                if ((pWInfo->okOnePass == '\0') && (pTVar6->nCol < 0x40)) {
                  uVar57 = pSVar47->colUsed;
                  uVar38 = 0x3f;
                  if (uVar57 != 0) {
                    for (; uVar57 >> uVar38 == 0; uVar38 = uVar38 - 1) {
                    }
                  }
                  pcVar31 = (char *)((uVar38 ^ 0xffffffffffffffc0) + 0x41);
                  if (uVar57 == 0) {
                    pcVar31 = (char *)0x0;
                  }
                  sqlite3VdbeChangeP4(pVVar5,pVVar5->nOp + -1,pcVar31,-0xe);
                }
              }
              else {
                sqlite3TableLock(pParse,iVar45,pTVar6->tnum,'\0',pTVar6->zName);
              }
            }
          }
          else {
            for (zP4 = pTVar6->pVTable; (zP4 != (VTable *)0x0 && (zP4->db != db)); zP4 = zP4->pNext)
            {
            }
            iVar20 = sqlite3VdbeAddOp3(pVVar5,0x87,pSVar47->iCursor,0,0);
            sqlite3VdbeChangeP4(pVVar5,iVar20,(char *)zP4,-10);
          }
        }
        pWVar9 = local_f8.pWC;
        uVar24 = (pWVar52->plan).wsFlags;
        if ((uVar24 >> 0x1d & 1) == 0) {
          if ((uVar24 & 0xf0000) != 0) {
            pIVar27 = (pWVar52->plan).u.pIdx;
            pKVar26 = sqlite3IndexKeyinfo(pParse,pIVar27);
            iVar20 = sqlite3VdbeAddOp3(pVVar5,0x27,pWVar52->iIdxCur,pIVar27->tnum,iVar45);
            sqlite3VdbeChangeP4(pVVar5,iVar20,(char *)pKVar26,-0x10);
          }
        }
        else {
          p = pParse->pVdbe;
          p_00 = sqlite3GetVdbe(pParse);
          iVar20 = pParse->nOnce;
          pParse->nOnce = iVar20 + 1;
          iVar55 = 0;
          uVar24 = sqlite3VdbeAddOp3(p_00,0x1a,iVar20,0,0);
          pTVar6 = pSVar47->pTab;
          pWVar25 = pWVar9->a;
          pWVar44 = pWVar25 + pWVar9->nTerm;
          if ((long)pWVar9->nTerm < 1) {
            uVar57 = 0xffffffffffffffff;
          }
          else {
            iVar55 = 0;
            uVar57 = 0;
            do {
              iVar20 = termCanDriveIndex(pWVar25,pSVar47,local_1b8);
              if (iVar20 != 0) {
                uVar38 = 1L << ((byte)(pWVar25->u).leftColumn & 0x3f);
                if (0x3f < (pWVar25->u).leftColumn) {
                  uVar38 = 0x8000000000000000;
                }
                bVar61 = (uVar38 & uVar57) == 0;
                if (!bVar61) {
                  uVar38 = 0;
                }
                uVar57 = uVar57 | uVar38;
                iVar55 = iVar55 + (uint)bVar61;
              }
              pWVar25 = pWVar25 + 1;
            } while (pWVar25 < pWVar44);
            uVar57 = ~uVar57 | 0x8000000000000000;
          }
          (pWVar52->plan).nEq = (u16)iVar55;
          uVar38 = pSVar47->colUsed;
          uVar57 = uVar57 & uVar38;
          uVar21 = (uint)pTVar6->nCol;
          uVar39 = uVar21;
          if (0x3e < (int)uVar21) {
            uVar39 = 0x3f;
          }
          if (0 < (int)uVar39) {
            uVar43 = 0;
            do {
              iVar55 = iVar55 + (uint)((uVar57 >> (uVar43 & 0x3f) & 1) != 0);
              uVar43 = uVar43 + 1;
            } while (uVar39 != uVar43);
          }
          (pWVar52->plan).wsFlags = (pWVar52->plan).wsFlags | 0x410002;
          iVar55 = ((uint)((long)uVar38 >> 0x3f) & uVar21 - 0x3f) + iVar55;
          iVar20 = iVar55 * 0xd + 0x50;
          pIVar27 = (Index *)sqlite3DbMallocRaw(pParse->db,iVar20);
          if (pIVar27 != (Index *)0x0) {
            iVar59 = 0;
            memset(pIVar27,0,(long)iVar20);
            (pWVar52->plan).u.pIdx = pIVar27;
            pIVar27->azColl = &pIVar27[1].zName;
            pIVar27->aiColumn = (int *)(&pIVar27[1].zName + iVar55);
            pIVar27->aSortOrder = (u8 *)((long)(&pIVar27[1].zName + iVar55) + (long)iVar55 * 4);
            pIVar27->zName = "auto-index";
            pIVar27->nColumn = (u16)iVar55;
            pIVar27->pTable = pTVar6;
            pWVar25 = pWVar9->a;
            if (pWVar25 < pWVar44) {
              iVar59 = 0;
              local_178 = 0.0;
              do {
                iVar20 = termCanDriveIndex(pWVar25,pSVar47,local_1b8);
                if (iVar20 != 0) {
                  iVar20 = (pWVar25->u).leftColumn;
                  uVar38 = 1L << ((byte)iVar20 & 0x3f);
                  if (0x3f < iVar20) {
                    uVar38 = 0x8000000000000000;
                  }
                  if (((ulong)local_178 & uVar38) == 0) {
                    pEVar34 = pWVar25->pExpr;
                    pIVar27->aiColumn[iVar59] = iVar20;
                    pCVar28 = sqlite3BinaryCompareCollSeq(pParse,pEVar34->pLeft,pEVar34->pRight);
                    pcVar31 = "BINARY";
                    if (pCVar28 != (CollSeq *)0x0) {
                      pcVar31 = pCVar28->zName;
                    }
                    local_178 = (double)((ulong)local_178 | uVar38);
                    pIVar27->azColl[iVar59] = pcVar31;
                    iVar59 = iVar59 + 1;
                  }
                }
                pWVar25 = pWVar25 + 1;
              } while (pWVar25 < pWVar44);
            }
            if (0 < (int)uVar39) {
              uVar38 = 0;
              do {
                if ((uVar57 >> (uVar38 & 0x3f) & 1) != 0) {
                  pIVar27->aiColumn[iVar59] = (int)uVar38;
                  pIVar27->azColl[iVar59] = "BINARY";
                  iVar59 = iVar59 + 1;
                }
                uVar38 = uVar38 + 1;
              } while (uVar39 != uVar38);
            }
            if (((long)pSVar47->colUsed < 0) && (sVar2 = pTVar6->nCol, 0x3f < sVar2)) {
              lVar36 = (long)iVar59;
              iVar20 = 0x3f;
              do {
                pIVar27->aiColumn[lVar36] = iVar20;
                pIVar27->azColl[lVar36] = "BINARY";
                lVar36 = lVar36 + 1;
                iVar20 = iVar20 + 1;
              } while (sVar2 != iVar20);
            }
            pKVar26 = sqlite3IndexKeyinfo(pParse,pIVar27);
            iVar20 = sqlite3VdbeAddOp3(p,0x29,pWVar52->iIdxCur,iVar55 + 1,0);
            sqlite3VdbeChangeP4(p,iVar20,(char *)pKVar26,-0x10);
            uVar39 = sqlite3VdbeAddOp3(p,0x48,pWVar52->iTabCur,0,0);
            if (pParse->nTempReg == '\0') {
              iVar20 = pParse->nMem + 1;
              pParse->nMem = iVar20;
            }
            else {
              bVar53 = pParse->nTempReg - 1;
              pParse->nTempReg = bVar53;
              iVar20 = pParse->aTempReg[bVar53];
            }
            sqlite3GenerateIndexKey(pParse,pIVar27,pWVar52->iTabCur,iVar20,1);
            sqlite3VdbeAddOp3(p,0x61,pWVar52->iIdxCur,iVar20,0);
            if (p->aOp != (Op *)0x0) {
              p->aOp[(long)p->nOp + -1].p5 = '\x10';
            }
            sqlite3VdbeAddOp3(p,0x5f,pWVar52->iTabCur,uVar39 + 1,0);
            pOVar7 = p->aOp;
            if (pOVar7 != (Op *)0x0) {
              pOVar7[(long)p->nOp + -1].p5 = '\x03';
            }
            if ((-1 < (int)uVar39) && (uVar39 < (uint)p->nOp)) {
              pOVar7[uVar39].p2 = p->nOp;
            }
            if (iVar20 != 0) {
              bVar53 = pParse->nTempReg;
              if ((ulong)bVar53 < 8) {
                lVar36 = 0;
                do {
                  if (*(int *)((long)&pParse->aColCache[0].iReg + lVar36) == iVar20) {
                    (&pParse->aColCache[0].tempReg)[lVar36] = '\x01';
                    goto LAB_001621fb;
                  }
                  lVar36 = lVar36 + 0x18;
                } while ((int)lVar36 != 0xf0);
                pParse->nTempReg = bVar53 + 1;
                pParse->aTempReg[bVar53] = iVar20;
              }
            }
LAB_001621fb:
            if ((-1 < (int)uVar24) && (uVar24 < (uint)p->nOp)) {
              pOVar7[uVar24].p2 = p->nOp;
            }
          }
        }
        sqlite3CodeVerifySchema(pParse,iVar45);
        lVar36 = (long)(local_f8.pWC)->pMaskSet->n;
        uVar57 = 0xffffffffffffffff;
        if (0 < lVar36) {
          lVar42 = 0;
          do {
            if ((local_f8.pWC)->pMaskSet->ix[lVar42] == pSVar47->iCursor) {
              bVar53 = (byte)lVar42 & 0x3f;
              uVar57 = -2L << bVar53 | 0xfffffffffffffffeU >> 0x40 - bVar53;
              break;
            }
            lVar42 = lVar42 + 1;
          } while (lVar36 != lVar42);
        }
        local_1b8 = local_1b8 & uVar57;
        uVar54 = uVar54 + 1;
        pWVar52 = pWVar52 + 1;
      } while (uVar54 != uVar15);
    }
    pWInfo->iTop = pVVar5->nOp;
    if (db->mallocFailed == '\0') {
      if ((int)uVar15 < 1) {
        return pWInfo;
      }
      pbVar41 = (byte *)((long)&pWInfo[1].savedNQueryLoop + 4);
      uVar57 = 0xffffffffffffffff;
      uVar38 = 0;
      iVar45 = 0;
      do {
        pWVar52 = pWVar1 + uVar38;
        iVar22 = (int)uVar38;
        explainOneScan(pParse,pTabList,pWVar52,iVar22,(uint)pWInfo->a[uVar38].iFrom,wctrlFlags);
        pParse_00 = pWInfo->pParse;
        pSVar8 = pWInfo->pTabList;
        pVVar5 = pParse_00->pVdbe;
        pWVar9 = pWInfo->pWC;
        bVar53 = pWInfo->a[uVar38].iFrom;
        iVar20 = pSVar8->a[bVar53].iCursor;
        uVar54 = pWVar1[uVar38].plan.wsFlags;
        iVar55 = sqlite3VdbeMakeLabel(pVVar5);
        pWInfo->a[uVar38].addrNxt = iVar55;
        pWInfo->a[uVar38].addrBrk = iVar55;
        iVar59 = sqlite3VdbeMakeLabel(pVVar5);
        pWInfo->a[uVar38].addrCont = iVar59;
        if ((pWInfo->a[uVar38].iFrom != '\0') && ((pSVar8->a[bVar53].jointype & 8) != 0)) {
          iVar35 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar35;
          pWVar52->iLeftJoin = iVar35;
          sqlite3VdbeAddOp3(pVVar5,7,0,iVar35,0);
        }
        if ((pSVar8->a[bVar53].field_0x39 & 4) == 0) {
          uVar24 = (pWVar52->plan).wsFlags;
          if ((uVar24 >> 0x1b & 1) != 0) {
            psVar10 = (pWVar52->plan).u.pVtabIdx;
            uVar54 = psVar10->nConstraint;
            psVar11 = psVar10->aConstraintUsage;
            psVar12 = psVar10->aConstraint;
            pParse_00->iCacheLevel = pParse_00->iCacheLevel + 1;
            iVar55 = uVar54 + 2;
            if (pParse_00->nRangeReg < iVar55) {
              iVar22 = pParse_00->nMem + 1;
              pParse_00->nMem = pParse_00->nMem + iVar55;
            }
            else {
              iVar22 = pParse_00->iRangeReg;
              pParse_00->iRangeReg = iVar22 + iVar55;
              pParse_00->nRangeReg = pParse_00->nRangeReg - iVar55;
            }
            iVar35 = pWVar52->addrBrk;
            if ((int)uVar54 < 1) {
              iVar23 = 0;
            }
            else {
              uVar24 = 1;
              do {
                uVar43 = 0;
                piVar29 = &psVar12->iTermOffset;
                do {
                  if (psVar11[uVar43].argvIndex == uVar24) {
                    iVar23 = iVar22 + 1 + uVar24;
                    pWVar25 = pWVar9->a + *piVar29;
                    if ((pWVar9->a[*piVar29].eOperator & 1) == 0) {
                      sqlite3ExprCode(pParse_00,pWVar25->pExpr->pRight,iVar23);
                    }
                    else {
                      codeEqualityTerm(pParse_00,pWVar25,pWVar52,(int)uVar43,iVar23);
                      iVar35 = pWVar52->addrNxt;
                    }
                    goto LAB_001626c3;
                  }
                  uVar43 = uVar43 + 1;
                  piVar29 = piVar29 + 3;
                } while (uVar54 != uVar43);
                uVar43 = (ulong)uVar54;
LAB_001626c3:
                uVar39 = uVar24;
              } while (((uint)uVar43 != uVar54) &&
                      (uVar39 = uVar24 + 1, bVar61 = uVar24 != uVar54, uVar24 = uVar39, bVar61));
              iVar23 = uVar39 - 1;
            }
            sqlite3VdbeAddOp3(pVVar5,7,psVar10->idxNum,iVar22,0);
            sqlite3VdbeAddOp3(pVVar5,7,iVar23,iVar22 + 1,0);
            pcVar31 = psVar10->idxStr;
            iVar23 = psVar10->needToFreeIdxStr;
            iVar35 = sqlite3VdbeAddOp3(pVVar5,0x88,iVar20,iVar35,iVar22);
            sqlite3VdbeChangeP4(pVVar5,iVar35,pcVar31,(uint)(iVar23 == 0) * 9 + -0xb);
            psVar10->needToFreeIdxStr = 0;
            if (0 < (int)uVar54) {
              piVar29 = &psVar12->iTermOffset;
              uVar43 = 0;
              do {
                if (psVar11[uVar43].omit != '\0') {
                  disableTerm(pWVar52,pWVar9->a + *piVar29);
                }
                uVar43 = uVar43 + 1;
                piVar29 = piVar29 + 3;
              } while (uVar54 != uVar43);
            }
            pWVar52->op = 0x8a;
            pWVar52->p1 = iVar20;
            pWVar52->p2 = pVVar5->nOp;
            iVar35 = iVar22;
            sqlite3ExprCacheRemove(pParse_00,iVar22,iVar55);
            if (pParse_00->nRangeReg < iVar55) {
              pParse_00->nRangeReg = iVar55;
              pParse_00->iRangeReg = iVar22;
            }
            sqlite3ExprCachePop(pParse_00,iVar35);
            iVar35 = 0;
            goto LAB_00162812;
          }
          if ((uVar24 >> 0xc & 1) != 0) {
            if (pParse_00->nTempReg == '\0') {
              iVar35 = pParse_00->nMem + 1;
              pParse_00->nMem = iVar35;
            }
            else {
              bVar53 = pParse_00->nTempReg - 1;
              pParse_00->nTempReg = bVar53;
              iVar35 = pParse_00->aTempReg[bVar53];
            }
            pWVar25 = findTerm(pWVar9,iVar20,-1,uVar57,3,(Index *)0x0);
            iVar22 = codeEqualityTerm(pParse_00,pWVar25,pWVar52,0,iVar35);
            iVar55 = pWVar52->addrNxt;
            sqlite3VdbeAddOp3(pVVar5,0x15,iVar22,iVar55,0);
            sqlite3VdbeAddOp3(pVVar5,0x36,iVar20,iVar55,iVar22);
            sqlite3ExprCacheRemove(pParse_00,iVar22,1);
            sqlite3ExprCacheStore(pParse_00,iVar20,-1,iVar22);
            pWVar52->op = 0x95;
            goto LAB_00162812;
          }
          if ((uVar24 >> 0xd & 1) != 0) {
            uVar54 = uVar54 & 0x1000000;
            pWVar30 = findTerm(pWVar9,iVar20,-1,uVar57,0x24,(Index *)0x0);
            pWVar25 = findTerm(pWVar9,iVar20,-1,uVar57,0x18,(Index *)0x0);
            pWVar44 = pWVar30;
            if (uVar54 != 0) {
              pWVar44 = pWVar25;
              pWVar25 = pWVar30;
            }
            if (pWVar44 == (WhereTerm *)0x0) {
              sqlite3VdbeAddOp3(pVVar5,(uint)(uVar54 == 0) * 5 + 0x43,iVar20,iVar55,0);
            }
            else {
              pEVar34 = pWVar44->pExpr;
              iVar22 = sqlite3ExprCodeTemp(pParse_00,pEVar34->pRight,(int *)&local_78);
              sqlite3VdbeAddOp3(pVVar5,(uint)*(byte *)((long)yy_reduce_ofst +
                                                      (ulong)pEVar34->op + 0x23b),iVar20,iVar55,
                                iVar22);
              sqlite3ExprCacheRemove(pParse_00,iVar22,1);
              if (local_78._0_4_ != 0) {
                bVar53 = pParse_00->nTempReg;
                if ((ulong)bVar53 < 8) {
                  lVar36 = 0;
                  do {
                    if (*(int *)((long)&pParse_00->aColCache[0].iReg + lVar36) == local_78._0_4_) {
                      (&pParse_00->aColCache[0].tempReg)[lVar36] = '\x01';
                      goto LAB_001631b5;
                    }
                    lVar36 = lVar36 + 0x18;
                  } while ((int)lVar36 != 0xf0);
                  pParse_00->nTempReg = bVar53 + 1;
                  pParse_00->aTempReg[bVar53] = local_78._0_4_;
                }
              }
LAB_001631b5:
              disableTerm(pWVar52,pWVar44);
            }
            if (pWVar25 == (WhereTerm *)0x0) {
              iVar23 = 0x95;
              iVar22 = 0;
            }
            else {
              pEVar34 = pWVar25->pExpr;
              iVar22 = pParse_00->nMem + 1;
              pParse_00->nMem = iVar22;
              sqlite3ExprCode(pParse_00,pEVar34->pRight,iVar22);
              if ((pEVar34->op | 2) == 0x4f) {
                iVar23 = (uint)(uVar54 == 0) * 2 + 0x4e;
              }
              else {
                iVar23 = (uint)(uVar54 != 0) * 2 + 0x4d;
              }
              disableTerm(pWVar52,pWVar25);
            }
            iVar35 = pVVar5->nOp;
            pWVar52->op = (uVar54 == 0) * '\x03' + '\\';
            pWVar52->p1 = iVar20;
            pWVar52->p2 = iVar35;
            if (pWVar44 == (WhereTerm *)0x0 && pWVar25 == (WhereTerm *)0x0) {
              pWVar52->p5 = '\x01';
            }
            iVar35 = 0;
            if (iVar23 != 0x95) {
              if (pParse_00->nTempReg == '\0') {
                iVar35 = pParse_00->nMem + 1;
                pParse_00->nMem = iVar35;
              }
              else {
                bVar53 = pParse_00->nTempReg - 1;
                pParse_00->nTempReg = bVar53;
                iVar35 = pParse_00->aTempReg[bVar53];
              }
              sqlite3VdbeAddOp3(pVVar5,0x41,iVar20,iVar35,0);
              sqlite3ExprCacheStore(pParse_00,iVar20,-1,iVar35);
              sqlite3VdbeAddOp3(pVVar5,iVar23,iVar22,iVar55,iVar35);
              if (pVVar5->aOp != (Op *)0x0) {
                pVVar5->aOp[(long)pVVar5->nOp + -1].p5 = 'k';
              }
            }
            goto LAB_00162812;
          }
          uVar39 = (uVar54 & 0x1000000) >> 0x18;
          uVar43 = (ulong)uVar39;
          if ((uVar24 & 0x30000) != 0) {
            uVar3 = (pWVar52->plan).nEq;
            uVar56 = (ulong)uVar3;
            pIVar27 = (pWVar52->plan).u.pIdx;
            uVar4 = pIVar27->nColumn;
            iVar55 = -1;
            if (uVar3 != uVar4) {
              iVar55 = pIVar27->aiColumn[uVar56];
            }
            uVar21 = 0;
            bVar61 = true;
            if (((wctrlFlags & 1) != 0) && ((uVar24 & 0x800000) != 0)) {
              bVar61 = uVar4 <= uVar3;
              uVar21 = (uint)(uVar3 < uVar4);
            }
            iVar22 = pWVar52->iIdxCur;
            if ((uVar24 >> 0x14 & 1) == 0) {
              local_158 = (WhereTerm *)0x0;
            }
            else {
              local_158 = findTerm(pWVar9,iVar20,iVar55,uVar57,0x18,pIVar27);
              uVar21 = 1;
            }
            if (((pWVar52->plan).wsFlags & 0x200000) == 0) {
              local_1b0 = (WhereTerm *)0x0;
            }
            else {
              local_1b0 = findTerm(pWVar9,iVar20,iVar55,uVar57,0x24,pIVar27);
              uVar21 = 1;
            }
            iVar35 = codeAllEqualityTerms(pParse_00,pWVar52,pWVar9,uVar57,uVar21,(char **)&local_78)
            ;
            zAff = local_78._0_8_;
            pcVar31 = sqlite3DbStrDup(pParse_00->db,(char *)local_78._0_8_);
            iVar55 = pWVar52->addrNxt;
            pWVar25 = local_158;
            if (uVar3 < pIVar27->nColumn) {
              if (uVar39 != (pIVar27->aSortOrder[uVar56] == '\0')) {
LAB_00162d61:
                pWVar25 = local_1b0;
                local_1b0 = local_158;
              }
            }
            else if (pIVar27->nColumn != uVar3 || (uVar54 & 0x1000000) == 0) goto LAB_00162d61;
            uVar24 = 1;
            uVar21 = 1;
            if (pWVar25 != (WhereTerm *)0x0) {
              uVar21 = (uint)((pWVar25->eOperator & 0x28) != 0);
            }
            if (local_1b0 != (WhereTerm *)0x0) {
              uVar24 = (uint)((local_1b0->eOperator & 0x28) != 0);
            }
            bVar60 = uVar56 != 0 || pWVar25 != (WhereTerm *)0x0;
            p2 = (uint)uVar3;
            if (pWVar25 == (WhereTerm *)0x0) {
              n = p2;
              if (!bVar61) {
                uVar21 = 0;
                sqlite3VdbeAddOp3(pVVar5,10,0,iVar35 + (uint)uVar3,0);
                n = uVar3 + 1;
                bVar60 = true;
              }
            }
            else {
              pEVar34 = pWVar25->pExpr->pRight;
              sqlite3ExprCode(pParse_00,pEVar34,iVar35 + p2);
              sqlite3ExprCodeIsNullJump(pVVar5,pEVar34,iVar35 + p2,iVar55);
              if ((_func_int_Walker_ptr_Expr_ptr *)zAff != (_func_int_Walker_ptr_Expr_ptr *)0x0) {
                cVar17 = sqlite3CompareAffinity
                                   (pEVar34,(char)*(_func_int_Walker_ptr_Expr_ptr *)(zAff + uVar56))
                ;
                if (cVar17 == 'b') {
                  *(code *)(zAff + uVar56) = (code)0x62;
                }
                iVar23 = sqlite3ExprNeedsNoAffinityChange
                                   (pEVar34,(char)*(_func_int_Walker_ptr_Expr_ptr *)(zAff + uVar56))
                ;
                if (iVar23 != 0) {
                  *(code *)(zAff + uVar56) = (code)0x62;
                }
              }
              n = uVar3 + 1;
            }
            codeApplyAffinity(pParse_00,iVar35,n,(char *)zAff);
            sqlite3VdbeAddOp4Int
                      (pVVar5,(uint)(byte)(&codeOneLoopStart_aStartOp)
                                          [(uint)bVar60 * 4 + uVar21 * 2 + uVar39],iVar22,iVar55,
                       iVar35,n);
            local_16c = (uint)uVar3;
            if (local_1b0 != (WhereTerm *)0x0) {
              pEVar34 = local_1b0->pExpr->pRight;
              iVar23 = iVar35 + local_16c;
              sqlite3ExprCacheRemove(pParse_00,iVar23,1);
              sqlite3ExprCode(pParse_00,pEVar34,iVar23);
              sqlite3ExprCodeIsNullJump(pVVar5,pEVar34,iVar23,iVar55);
              if (pcVar31 != (char *)0x0) {
                cVar17 = sqlite3CompareAffinity(pEVar34,pcVar31[uVar56]);
                if (cVar17 == 'b') {
                  pcVar31[uVar56] = 'b';
                }
                iVar23 = sqlite3ExprNeedsNoAffinityChange(pEVar34,pcVar31[uVar56]);
                if (iVar23 != 0) {
                  pcVar31[uVar56] = 'b';
                }
              }
              local_16c = uVar3 + 1;
              codeApplyAffinity(pParse_00,iVar35,local_16c,pcVar31);
            }
            sqlite3DbFree(pParse_00->db,(void *)zAff);
            sqlite3DbFree(pParse_00->db,pcVar31);
            pWVar52->p2 = pVVar5->nOp;
            if ((uVar56 != 0) || (local_1b0 != (WhereTerm *)0x0)) {
              sqlite3VdbeAddOp4Int
                        (pVVar5,(uint)*(byte *)((long)&codeOneLoopStart_aEndOp + uVar43 + 1),iVar22,
                         iVar55,iVar35,local_16c);
              if (pVVar5->aOp != (Op *)0x0) {
                pVVar5->aOp[(long)pVVar5->nOp + -1].p5 = uVar24 != uVar39;
              }
            }
            if (pParse_00->nTempReg == '\0') {
              iVar55 = pParse_00->nMem + 1;
              pParse_00->nMem = iVar55;
            }
            else {
              bVar53 = pParse_00->nTempReg - 1;
              pParse_00->nTempReg = bVar53;
              iVar55 = pParse_00->aTempReg[bVar53];
            }
            if (((pWVar52->plan).wsFlags & 0x300000) != 0) {
              sqlite3VdbeAddOp3(pVVar5,0x1d,iVar22,p2,iVar55);
              sqlite3VdbeAddOp3(pVVar5,0x49,iVar55,iVar59,0);
            }
            if (iVar55 != 0) {
              bVar53 = pParse_00->nTempReg;
              if ((ulong)bVar53 < 8) {
                lVar36 = 0;
                do {
                  if (*(int *)((long)&pParse_00->aColCache[0].iReg + lVar36) == iVar55) {
                    (&pParse_00->aColCache[0].tempReg)[lVar36] = '\x01';
                    goto LAB_00163318;
                  }
                  lVar36 = lVar36 + 0x18;
                } while ((int)lVar36 != 0xf0);
                pParse_00->nTempReg = bVar53 + 1;
                pParse_00->aTempReg[bVar53] = iVar55;
              }
            }
LAB_00163318:
            disableTerm(pWVar52,pWVar25);
            disableTerm(pWVar52,local_1b0);
            iVar35 = 0;
            if (((wctrlFlags & 0x20) == 0 & (byte)(uVar54 >> 0x16) & 1) == 0) {
              if (pParse_00->nTempReg == '\0') {
                iVar35 = pParse_00->nMem + 1;
                pParse_00->nMem = iVar35;
              }
              else {
                bVar53 = pParse_00->nTempReg - 1;
                pParse_00->nTempReg = bVar53;
                iVar35 = pParse_00->aTempReg[bVar53];
              }
              sqlite3VdbeAddOp3(pVVar5,99,iVar22,iVar35,0);
              sqlite3ExprCacheStore(pParse_00,iVar20,-1,iVar35);
              sqlite3VdbeAddOp3(pVVar5,0x32,iVar20,iVar35,0);
            }
            uVar24 = (pWVar52->plan).wsFlags;
            uVar18 = ((uVar54 & 0x1000000) == 0) * '\x03' + '\\';
            if ((uVar24 >> 0x19 & 1) != 0) {
              uVar18 = 0x95;
            }
            pWVar52->op = uVar18;
            pWVar52->p1 = iVar22;
            if ((int)uVar24 < 0) {
              pWVar52->p5 = '\x01';
            }
            goto LAB_00162812;
          }
          if ((uVar24 >> 0x1c & 1) == 0) {
            pWVar52->op = *(u8 *)((long)&codeOneLoopStart_aStep + uVar43);
            pWVar52->p1 = iVar20;
            iVar55 = sqlite3VdbeAddOp3(pVVar5,(uint)*(byte *)((long)&codeOneLoopStart_aStart +
                                                             uVar43),iVar20,iVar55,0);
            pWVar52->p2 = iVar55 + 1;
            pWVar52->p5 = '\x01';
            iVar35 = 0;
            goto LAB_00162812;
          }
          iVar55 = pParse_00->nTab;
          pParse_00->nTab = iVar55 + 1;
          iVar23 = pParse_00->nMem + 1;
          pParse_00->nMem = iVar23;
          uVar54 = sqlite3VdbeMakeLabel(pVVar5);
          pIVar27 = (pWVar52->plan).u.pIdx;
          ptVar13 = pIVar27->aiRowEst;
          pWVar52->op = '\x03';
          pWVar52->p1 = iVar23;
          iVar35 = pWInfo->nLevel;
          if (iVar35 < 2) {
            local_1a0 = pWInfo->pTabList;
LAB_001633fb:
            iVar35 = 0;
            iVar46 = 0;
            if ((wctrlFlags & 8) == 0) {
              iVar35 = pParse_00->nMem + 1;
              iVar46 = pParse_00->nMem + 2;
              pParse_00->nMem = iVar46;
              sqlite3VdbeAddOp3(pVVar5,10,0,iVar35,0);
            }
            uVar24 = sqlite3VdbeAddOp3(pVVar5,7,0,iVar23,0);
            if (pWVar9->nTerm < 2) {
              pEVar34 = (Expr *)0x0;
            }
            else {
              if (pWVar9->nTerm < 1) {
                pEVar34 = (Expr *)0x0;
              }
              else {
                lVar36 = 0x1a;
                lVar42 = 0;
                pEVar34 = (Expr *)0x0;
                do {
                  pWVar25 = pWVar9->a;
                  pEVar33 = *(Expr **)((long)pWVar25 + lVar36 + -0x1a);
                  if ((((pEVar33->flags & 1) == 0) &&
                      ((*(byte *)((long)&pWVar25->pExpr + lVar36) & 0x12) == 0)) &&
                     ((*(ushort *)((long)pWVar25 + lVar36 + -2) & 0xfff) != 0)) {
                    pEVar33 = exprDup(pParse_00->db,pEVar33,0,(u8 **)0x0);
                    pEVar34 = sqlite3ExprAnd(pParse_00->db,pEVar34,pEVar33);
                  }
                  lVar42 = lVar42 + 1;
                  lVar36 = lVar36 + 0x38;
                } while (lVar42 < pWVar9->nTerm);
              }
              if (pEVar34 == (Expr *)0x0) {
                pEVar34 = (Expr *)0x0;
              }
              else {
                pEVar34 = sqlite3PExpr(pParse_00,0x45,(Expr *)0x0,pEVar34,(Token *)0x0);
              }
            }
            if ((int)ptVar13[7] < 1) {
              bVar61 = true;
              local_188 = (Index *)0x0;
            }
            else {
              lVar36 = 0;
              uVar43 = 0;
              bVar61 = false;
              local_188 = (Index *)0x0;
              do {
                lVar42 = *(long *)(ptVar13 + 10);
                if ((*(int *)(lVar42 + 0xc + lVar36) == iVar20) ||
                   ((*(byte *)(lVar42 + 0x19 + lVar36) & 2) != 0)) {
                  pEVar33 = *(Expr **)(lVar42 + lVar36);
                  if ((pEVar34 != (Expr *)0x0) && ((pEVar33->flags & 1) == 0)) {
                    pEVar34->pLeft = pEVar33;
                    pEVar33 = pEVar34;
                  }
                  pWInfo_00 = sqlite3WhereBegin(pParse_00,local_1a0,pEVar33,(ExprList *)0x0,
                                                (ExprList *)0x0,0xf0,iVar55);
                  if (pWInfo_00 != (WhereInfo *)0x0) {
                    explainOneScan(pParse_00,local_1a0,pWInfo_00->a,iVar22,(uint)pWVar52->iFrom,0);
                    if ((wctrlFlags & 8) == 0) {
                      p4 = (int)uVar43;
                      if (uVar43 == ptVar13[7] - 1) {
                        p4 = -1;
                      }
                      p3 = sqlite3ExprCodeGetColumn
                                     (pParse_00,pSVar8->a[bVar53].pTab,-1,iVar20,iVar46,'\0');
                      sqlite3VdbeAddOp4Int(pVVar5,0x72,iVar35,pVVar5->nOp + 2,p3,p4);
                    }
                    sqlite3VdbeAddOp3(pVVar5,2,iVar23,uVar54,0);
                    if (pWInfo_00->untestedTerms != '\0') {
                      bVar61 = true;
                    }
                    uVar39 = pWInfo_00->a[0].plan.wsFlags;
                    if ((((byte)(uVar39 >> 0x1d) & 1) == 0 && (uVar39 & 0xf0000) != 0) &&
                       ((lVar36 == 0 || (pWInfo_00->a[0].plan.u.pIdx == local_188)))) {
                      local_188 = pWInfo_00->a[0].plan.u.pIdx;
                    }
                    else {
                      local_188 = (Index *)0x0;
                    }
                    sqlite3WhereEnd(pWInfo_00);
                  }
                }
                uVar43 = uVar43 + 1;
                lVar36 = lVar36 + 0x38;
              } while ((long)uVar43 < (long)(int)ptVar13[7]);
              bVar61 = !bVar61;
            }
            (pWVar52->u).pCovidx = local_188;
            if (local_188 != (Index *)0x0) {
              pWVar52->iIdxCur = iVar55;
            }
            if (pEVar34 != (Expr *)0x0) {
              pEVar34->pLeft = (Expr *)0x0;
              sqlite3ExprDelete(pParse_00->db,pEVar34);
            }
            if (uVar24 < (uint)pVVar5->nOp) {
              pVVar5->aOp[uVar24].p1 = pVVar5->nOp;
            }
            sqlite3VdbeAddOp3(pVVar5,1,0,pWVar52->addrBrk,0);
            if (pVVar5->aLabel != (int *)0x0) {
              pVVar5->aLabel[(int)~uVar54] = pVVar5->nOp;
            }
            if (1 < pWInfo->nLevel) {
              sqlite3DbFree(pParse_00->db,local_1a0);
            }
            iVar35 = 0;
            if (bVar61) {
              disableTerm(pWVar52,(WhereTerm *)pIVar27);
              iVar35 = 0;
            }
            goto LAB_00162812;
          }
          iVar46 = iVar35 - iVar22;
          local_1a0 = (SrcList *)sqlite3DbMallocRaw(pParse_00->db,iVar46 * 0x68 + 8);
          if (local_1a0 != (SrcList *)0x0) {
            local_1a0->nAlloc = (i16)iVar46;
            local_1a0->nSrc = (i16)iVar46;
            pSVar47 = pSVar8->a + bVar53;
            pSVar49 = local_1a0->a;
            for (lVar36 = 0xd; lVar36 != 0; lVar36 = lVar36 + -1) {
              pSVar49->pSchema = pSVar47->pSchema;
              pSVar47 = (SrcList_item *)((long)pSVar47 + ((ulong)bVar62 * -2 + 1) * 8);
              pSVar49 = (SrcList_item *)((long)pSVar49 + (ulong)bVar62 * -0x10 + 8);
            }
            if (1 < iVar46) {
              pSVar14 = pWInfo->pTabList;
              pSVar32 = local_1a0 + 1;
              lVar36 = (ulong)(uint)(iVar35 + iVar45) - 1;
              pbVar51 = pbVar41;
              do {
                pSVar47 = pSVar14->a + *pbVar51;
                pSVar50 = pSVar32;
                for (lVar42 = 0xd; lVar42 != 0; lVar42 = lVar42 + -1) {
                  *(Schema **)pSVar50 = pSVar47->pSchema;
                  pSVar47 = (SrcList_item *)((long)pSVar47 + (ulong)bVar62 * -0x10 + 8);
                  pSVar50 = (SrcList *)((long)pSVar50 + (ulong)bVar62 * -0x10 + 8);
                }
                pSVar32 = (SrcList *)&pSVar32->a[0].pIndex;
                pbVar51 = pbVar51 + 0x60;
                lVar36 = lVar36 + -1;
              } while (lVar36 != 0);
            }
            goto LAB_001633fb;
          }
        }
        else {
          iVar22 = pSVar8->a[bVar53].regReturn;
          iVar35 = 0;
          sqlite3VdbeAddOp3(pVVar5,7,pSVar8->a[bVar53].addrFillSub + -1,iVar22,0);
          iVar23 = sqlite3VdbeAddOp3(pVVar5,4,iVar22,0,0);
          pWVar52->p2 = iVar23;
          sqlite3VdbeAddOp3(pVVar5,0x1b,iVar22 + 1,iVar55,0);
          pWVar52->op = '\x01';
LAB_00162812:
          lVar36 = (long)pWVar9->pMaskSet->n;
          uVar43 = 0xffffffffffffffff;
          if (0 < lVar36) {
            lVar42 = 0;
            do {
              if (pWVar9->pMaskSet->ix[lVar42] == iVar20) {
                bVar53 = (byte)lVar42 & 0x3f;
                uVar43 = -2L << bVar53 | 0xfffffffffffffffeU >> 0x40 - bVar53;
                break;
              }
              lVar42 = lVar42 + 1;
            } while (lVar36 != lVar42);
          }
          uVar43 = uVar43 & uVar57;
          if (0 < pWVar9->nTerm) {
            pWVar25 = pWVar9->a;
            iVar55 = pWVar9->nTerm + 1;
            do {
              if ((pWVar25->wtFlags & 6) == 0) {
                if ((pWVar25->prereqAll & uVar43) == 0) {
                  if ((pWVar52->iLeftJoin == 0) || ((pWVar25->pExpr->flags & 1) != 0)) {
                    sqlite3ExprIfFalse(pParse_00,pWVar25->pExpr,iVar59,8);
                    pWVar25->wtFlags = pWVar25->wtFlags | 4;
                  }
                }
                else {
                  pWInfo->untestedTerms = '\x01';
                }
              }
              pWVar25 = pWVar25 + 1;
              iVar55 = iVar55 + -1;
            } while (1 < iVar55);
          }
          if (0 < pWVar9->nTerm) {
            iVar55 = pWVar9->nTerm + 1;
            puVar58 = &pWVar9->a->wtFlags;
            do {
              if ((((*puVar58 & 6) == 0) && (*(u16 *)(puVar58 + -2) == 0x402)) &&
                 (*(int *)(puVar58 + -0xe) == iVar20)) {
                pEVar34 = ((WhereTerm *)(puVar58 + -0x1a))->pExpr;
                pWVar25 = findTerm(pWVar9,iVar20,
                                   ((anon_union_8_3_737c4e49_for_u *)(puVar58 + -10))->leftColumn,
                                   uVar57,3,(Index *)0x0);
                if ((pWVar25 != (WhereTerm *)0x0) && ((pWVar25->wtFlags & 4) == 0)) {
                  pEVar33 = pWVar25->pExpr;
                  pEVar48 = &local_78;
                  for (lVar36 = 9; lVar36 != 0; lVar36 = lVar36 + -1) {
                    cVar17 = pEVar33->affinity;
                    uVar19 = pEVar33->flags;
                    uVar16 = *(undefined4 *)&pEVar33->field_0x4;
                    pEVar48->op = pEVar33->op;
                    pEVar48->affinity = cVar17;
                    pEVar48->flags = uVar19;
                    *(undefined4 *)&pEVar48->field_0x4 = uVar16;
                    pEVar33 = (Expr *)((long)pEVar33 + ((ulong)bVar62 * -2 + 1) * 8);
                    pEVar48 = (Expr *)((long)pEVar48 + (ulong)bVar62 * -0x10 + 8);
                  }
                  local_78.pLeft = pEVar34->pLeft;
                  sqlite3ExprIfFalse(pParse_00,&local_78,iVar59,8);
                }
              }
              iVar55 = iVar55 + -1;
              puVar58 = puVar58 + 0x38;
            } while (1 < iVar55);
          }
          if (pWVar52->iLeftJoin != 0) {
            pWVar52->addrFirst = pVVar5->nOp;
            sqlite3VdbeAddOp3(pVVar5,7,1,pWVar52->iLeftJoin,0);
            sqlite3ExprCacheClear(pParse_00);
            if (0 < pWVar9->nTerm) {
              pWVar25 = pWVar9->a;
              iVar20 = 0;
              do {
                if (((pWVar25->wtFlags & 6) == 0) && ((pWVar25->prereqAll & uVar43) == 0)) {
                  sqlite3ExprIfFalse(pParse_00,pWVar25->pExpr,iVar59,8);
                  pWVar25->wtFlags = pWVar25->wtFlags | 4;
                }
                iVar20 = iVar20 + 1;
                pWVar25 = pWVar25 + 1;
              } while (iVar20 < pWVar9->nTerm);
            }
          }
          uVar57 = uVar43;
          if (iVar35 != 0) {
            bVar53 = pParse_00->nTempReg;
            if ((ulong)bVar53 < 8) {
              lVar36 = 0;
              do {
                if (*(int *)((long)&pParse_00->aColCache[0].iReg + lVar36) == iVar35) {
                  (&pParse_00->aColCache[0].tempReg)[lVar36] = '\x01';
                  goto LAB_0016350d;
                }
                lVar36 = lVar36 + 0x18;
              } while ((int)lVar36 != 0xf0);
              pParse_00->nTempReg = bVar53 + 1;
              pParse_00->aTempReg[bVar53] = iVar35;
            }
          }
        }
LAB_0016350d:
        pWInfo->iContinue = pWVar52->addrCont;
        uVar38 = uVar38 + 1;
        iVar45 = iVar45 + -1;
        pbVar41 = pbVar41 + 0x60;
        if (uVar38 == uVar15) {
          return pWInfo;
        }
      } while( true );
    }
  }
LAB_0016141c:
  if (pWInfo != (WhereInfo *)0x0) {
    pParse->nQueryLoop = pWInfo->savedNQueryLoop;
    whereInfoFree(db,pWInfo);
  }
  return (WhereInfo *)0x0;
LAB_001615c2:
  pWInfo->eDistinct = '\x01';
  pDistinct = (ExprList *)0x0;
  goto LAB_001615d2;
}

Assistant:

SQLITE_PRIVATE WhereInfo *sqlite3WhereBegin(
  Parse *pParse,        /* The parser context */
  SrcList *pTabList,    /* A list of all tables to be scanned */
  Expr *pWhere,         /* The WHERE clause */
  ExprList *pOrderBy,   /* An ORDER BY clause, or NULL */
  ExprList *pDistinct,  /* The select-list for DISTINCT queries - or NULL */
  u16 wctrlFlags,       /* One of the WHERE_* flags defined in sqliteInt.h */
  int iIdxCur           /* If WHERE_ONETABLE_ONLY is set, index cursor number */
){
  int nByteWInfo;            /* Num. bytes allocated for WhereInfo struct */
  int nTabList;              /* Number of elements in pTabList */
  WhereInfo *pWInfo;         /* Will become the return value of this function */
  Vdbe *v = pParse->pVdbe;   /* The virtual database engine */
  Bitmask notReady;          /* Cursors that are not yet positioned */
  WhereBestIdx sWBI;         /* Best index search context */
  WhereMaskSet *pMaskSet;    /* The expression mask set */
  WhereLevel *pLevel;        /* A single level in pWInfo->a[] */
  int iFrom;                 /* First unused FROM clause element */
  int andFlags;              /* AND-ed combination of all pWC->a[].wtFlags */
  int ii;                    /* Loop counter */
  sqlite3 *db;               /* Database connection */


  /* Variable initialization */
  memset(&sWBI, 0, sizeof(sWBI));
  sWBI.pParse = pParse;

  /* The number of tables in the FROM clause is limited by the number of
  ** bits in a Bitmask 
  */
  testcase( pTabList->nSrc==BMS );
  if( pTabList->nSrc>BMS ){
    sqlite3ErrorMsg(pParse, "at most %d tables in a join", BMS);
    return 0;
  }

  /* This function normally generates a nested loop for all tables in 
  ** pTabList.  But if the WHERE_ONETABLE_ONLY flag is set, then we should
  ** only generate code for the first table in pTabList and assume that
  ** any cursors associated with subsequent tables are uninitialized.
  */
  nTabList = (wctrlFlags & WHERE_ONETABLE_ONLY) ? 1 : pTabList->nSrc;

  /* Allocate and initialize the WhereInfo structure that will become the
  ** return value. A single allocation is used to store the WhereInfo
  ** struct, the contents of WhereInfo.a[], the WhereClause structure
  ** and the WhereMaskSet structure. Since WhereClause contains an 8-byte
  ** field (type Bitmask) it must be aligned on an 8-byte boundary on
  ** some architectures. Hence the ROUND8() below.
  */
  db = pParse->db;
  nByteWInfo = ROUND8(sizeof(WhereInfo)+(nTabList-1)*sizeof(WhereLevel));
  pWInfo = sqlite3DbMallocZero(db, 
      nByteWInfo + 
      sizeof(WhereClause) +
      sizeof(WhereMaskSet)
  );
  if( db->mallocFailed ){
    sqlite3DbFree(db, pWInfo);
    pWInfo = 0;
    goto whereBeginError;
  }
  pWInfo->nLevel = nTabList;
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  pWInfo->iBreak = sqlite3VdbeMakeLabel(v);
  pWInfo->pWC = sWBI.pWC = (WhereClause *)&((u8 *)pWInfo)[nByteWInfo];
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  pMaskSet = (WhereMaskSet*)&sWBI.pWC[1];
  sWBI.aLevel = pWInfo->a;

  /* Disable the DISTINCT optimization if SQLITE_DistinctOpt is set via
  ** sqlite3_test_ctrl(SQLITE_TESTCTRL_OPTIMIZATIONS,...) */
  if( OptimizationDisabled(db, SQLITE_DistinctOpt) ) pDistinct = 0;

  /* Split the WHERE clause into separate subexpressions where each
  ** subexpression is separated by an AND operator.
  */
  initMaskSet(pMaskSet);
  whereClauseInit(sWBI.pWC, pParse, pMaskSet, wctrlFlags);
  sqlite3ExprCodeConstants(pParse, pWhere);
  whereSplit(sWBI.pWC, pWhere, TK_AND);   /* IMP: R-15842-53296 */
    
  /* Special case: a WHERE clause that is constant.  Evaluate the
  ** expression and either jump over all of the code or fall thru.
  */
  if( pWhere && (nTabList==0 || sqlite3ExprIsConstantNotJoin(pWhere)) ){
    sqlite3ExprIfFalse(pParse, pWhere, pWInfo->iBreak, SQLITE_JUMPIFNULL);
    pWhere = 0;
  }

  /* Assign a bit from the bitmask to every term in the FROM clause.
  **
  ** When assigning bitmask values to FROM clause cursors, it must be
  ** the case that if X is the bitmask for the N-th FROM clause term then
  ** the bitmask for all FROM clause terms to the left of the N-th term
  ** is (X-1).   An expression from the ON clause of a LEFT JOIN can use
  ** its Expr.iRightJoinTable value to find the bitmask of the right table
  ** of the join.  Subtracting one from the right table bitmask gives a
  ** bitmask for all tables to the left of the join.  Knowing the bitmask
  ** for all tables to the left of a left join is important.  Ticket #3015.
  **
  ** Note that bitmasks are created for all pTabList->nSrc tables in
  ** pTabList, not just the first nTabList tables.  nTabList is normally
  ** equal to pTabList->nSrc but might be shortened to 1 if the
  ** WHERE_ONETABLE_ONLY flag is set.
  */
  for(ii=0; ii<pTabList->nSrc; ii++){
    createMask(pMaskSet, pTabList->a[ii].iCursor);
  }
#ifndef NDEBUG
  {
    Bitmask toTheLeft = 0;
    for(ii=0; ii<pTabList->nSrc; ii++){
      Bitmask m = getMask(pMaskSet, pTabList->a[ii].iCursor);
      assert( (m-1)==toTheLeft );
      toTheLeft |= m;
    }
  }
#endif

  /* Analyze all of the subexpressions.  Note that exprAnalyze() might
  ** add new virtual terms onto the end of the WHERE clause.  We do not
  ** want to analyze these virtual terms, so start analyzing at the end
  ** and work forward so that the added virtual terms are never processed.
  */
  exprAnalyzeAll(pTabList, sWBI.pWC);
  if( db->mallocFailed ){
    goto whereBeginError;
  }

  /* Check if the DISTINCT qualifier, if there is one, is redundant. 
  ** If it is, then set pDistinct to NULL and WhereInfo.eDistinct to
  ** WHERE_DISTINCT_UNIQUE to tell the caller to ignore the DISTINCT.
  */
  if( pDistinct && isDistinctRedundant(pParse, pTabList, sWBI.pWC, pDistinct) ){
    pDistinct = 0;
    pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
  }

  /* Chose the best index to use for each table in the FROM clause.
  **
  ** This loop fills in the following fields:
  **
  **   pWInfo->a[].pIdx      The index to use for this level of the loop.
  **   pWInfo->a[].wsFlags   WHERE_xxx flags associated with pIdx
  **   pWInfo->a[].nEq       The number of == and IN constraints
  **   pWInfo->a[].iFrom     Which term of the FROM clause is being coded
  **   pWInfo->a[].iTabCur   The VDBE cursor for the database table
  **   pWInfo->a[].iIdxCur   The VDBE cursor for the index
  **   pWInfo->a[].pTerm     When wsFlags==WO_OR, the OR-clause term
  **
  ** This loop also figures out the nesting order of tables in the FROM
  ** clause.
  */
  sWBI.notValid = ~(Bitmask)0;
  sWBI.pOrderBy = pOrderBy;
  sWBI.n = nTabList;
  sWBI.pDistinct = pDistinct;
  andFlags = ~0;
  WHERETRACE(("*** Optimizer Start ***\n"));
  for(sWBI.i=iFrom=0, pLevel=pWInfo->a; sWBI.i<nTabList; sWBI.i++, pLevel++){
    WhereCost bestPlan;         /* Most efficient plan seen so far */
    Index *pIdx;                /* Index for FROM table at pTabItem */
    int j;                      /* For looping over FROM tables */
    int bestJ = -1;             /* The value of j */
    Bitmask m;                  /* Bitmask value for j or bestJ */
    int isOptimal;              /* Iterator for optimal/non-optimal search */
    int ckOptimal;              /* Do the optimal scan check */
    int nUnconstrained;         /* Number tables without INDEXED BY */
    Bitmask notIndexed;         /* Mask of tables that cannot use an index */

    memset(&bestPlan, 0, sizeof(bestPlan));
    bestPlan.rCost = SQLITE_BIG_DBL;
    WHERETRACE(("*** Begin search for loop %d ***\n", sWBI.i));

    /* Loop through the remaining entries in the FROM clause to find the
    ** next nested loop. The loop tests all FROM clause entries
    ** either once or twice. 
    **
    ** The first test is always performed if there are two or more entries
    ** remaining and never performed if there is only one FROM clause entry
    ** to choose from.  The first test looks for an "optimal" scan.  In
    ** this context an optimal scan is one that uses the same strategy
    ** for the given FROM clause entry as would be selected if the entry
    ** were used as the innermost nested loop.  In other words, a table
    ** is chosen such that the cost of running that table cannot be reduced
    ** by waiting for other tables to run first.  This "optimal" test works
    ** by first assuming that the FROM clause is on the inner loop and finding
    ** its query plan, then checking to see if that query plan uses any
    ** other FROM clause terms that are sWBI.notValid.  If no notValid terms
    ** are used then the "optimal" query plan works.
    **
    ** Note that the WhereCost.nRow parameter for an optimal scan might
    ** not be as small as it would be if the table really were the innermost
    ** join.  The nRow value can be reduced by WHERE clause constraints
    ** that do not use indices.  But this nRow reduction only happens if the
    ** table really is the innermost join.  
    **
    ** The second loop iteration is only performed if no optimal scan
    ** strategies were found by the first iteration. This second iteration
    ** is used to search for the lowest cost scan overall.
    **
    ** Without the optimal scan step (the first iteration) a suboptimal
    ** plan might be chosen for queries like this:
    **   
    **   CREATE TABLE t1(a, b); 
    **   CREATE TABLE t2(c, d);
    **   SELECT * FROM t2, t1 WHERE t2.rowid = t1.a;
    **
    ** The best strategy is to iterate through table t1 first. However it
    ** is not possible to determine this with a simple greedy algorithm.
    ** Since the cost of a linear scan through table t2 is the same 
    ** as the cost of a linear scan through table t1, a simple greedy 
    ** algorithm may choose to use t2 for the outer loop, which is a much
    ** costlier approach.
    */
    nUnconstrained = 0;
    notIndexed = 0;

    /* The optimal scan check only occurs if there are two or more tables
    ** available to be reordered */
    if( iFrom==nTabList-1 ){
      ckOptimal = 0;  /* Common case of just one table in the FROM clause */
    }else{
      ckOptimal = -1;
      for(j=iFrom, sWBI.pSrc=&pTabList->a[j]; j<nTabList; j++, sWBI.pSrc++){
        m = getMask(pMaskSet, sWBI.pSrc->iCursor);
        if( (m & sWBI.notValid)==0 ){
          if( j==iFrom ) iFrom++;
          continue;
        }
        if( j>iFrom && (sWBI.pSrc->jointype & (JT_LEFT|JT_CROSS))!=0 ) break;
        if( ++ckOptimal ) break;
        if( (sWBI.pSrc->jointype & JT_LEFT)!=0 ) break;
      }
    }
    assert( ckOptimal==0 || ckOptimal==1 );

    for(isOptimal=ckOptimal; isOptimal>=0 && bestJ<0; isOptimal--){
      for(j=iFrom, sWBI.pSrc=&pTabList->a[j]; j<nTabList; j++, sWBI.pSrc++){
        if( j>iFrom && (sWBI.pSrc->jointype & (JT_LEFT|JT_CROSS))!=0 ){
          /* This break and one like it in the ckOptimal computation loop
          ** above prevent table reordering across LEFT and CROSS JOINs.
          ** The LEFT JOIN case is necessary for correctness.  The prohibition
          ** against reordering across a CROSS JOIN is an SQLite feature that
          ** allows the developer to control table reordering */
          break;
        }
        m = getMask(pMaskSet, sWBI.pSrc->iCursor);
        if( (m & sWBI.notValid)==0 ){
          assert( j>iFrom );
          continue;
        }
        sWBI.notReady = (isOptimal ? m : sWBI.notValid);
        if( sWBI.pSrc->pIndex==0 ) nUnconstrained++;
  
        WHERETRACE(("   === trying table %d (%s) with isOptimal=%d ===\n",
                    j, sWBI.pSrc->pTab->zName, isOptimal));
        assert( sWBI.pSrc->pTab );
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(sWBI.pSrc->pTab) ){
          sWBI.ppIdxInfo = &pWInfo->a[j].pIdxInfo;
          bestVirtualIndex(&sWBI);
        }else 
#endif
        {
          bestBtreeIndex(&sWBI);
        }
        assert( isOptimal || (sWBI.cost.used&sWBI.notValid)==0 );

        /* If an INDEXED BY clause is present, then the plan must use that
        ** index if it uses any index at all */
        assert( sWBI.pSrc->pIndex==0 
                  || (sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)==0
                  || sWBI.cost.plan.u.pIdx==sWBI.pSrc->pIndex );

        if( isOptimal && (sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)==0 ){
          notIndexed |= m;
        }
        if( isOptimal ){
          pWInfo->a[j].rOptCost = sWBI.cost.rCost;
        }else if( ckOptimal ){
          /* If two or more tables have nearly the same outer loop cost, but
          ** very different inner loop (optimal) cost, we want to choose
          ** for the outer loop that table which benefits the least from
          ** being in the inner loop.  The following code scales the 
          ** outer loop cost estimate to accomplish that. */
          WHERETRACE(("   scaling cost from %.1f to %.1f\n",
                      sWBI.cost.rCost,
                      sWBI.cost.rCost/pWInfo->a[j].rOptCost));
          sWBI.cost.rCost /= pWInfo->a[j].rOptCost;
        }

        /* Conditions under which this table becomes the best so far:
        **
        **   (1) The table must not depend on other tables that have not
        **       yet run.  (In other words, it must not depend on tables
        **       in inner loops.)
        **
        **   (2) (This rule was removed on 2012-11-09.  The scaling of the
        **       cost using the optimal scan cost made this rule obsolete.)
        **
        **   (3) All tables have an INDEXED BY clause or this table lacks an
        **       INDEXED BY clause or this table uses the specific
        **       index specified by its INDEXED BY clause.  This rule ensures
        **       that a best-so-far is always selected even if an impossible
        **       combination of INDEXED BY clauses are given.  The error
        **       will be detected and relayed back to the application later.
        **       The NEVER() comes about because rule (2) above prevents
        **       An indexable full-table-scan from reaching rule (3).
        **
        **   (4) The plan cost must be lower than prior plans, where "cost"
        **       is defined by the compareCost() function above. 
        */
        if( (sWBI.cost.used&sWBI.notValid)==0                    /* (1) */
            && (nUnconstrained==0 || sWBI.pSrc->pIndex==0        /* (3) */
                || NEVER((sWBI.cost.plan.wsFlags & WHERE_NOT_FULLSCAN)!=0))
            && (bestJ<0 || compareCost(&sWBI.cost, &bestPlan))   /* (4) */
        ){
          WHERETRACE(("   === table %d (%s) is best so far\n"
                      "       cost=%.1f, nRow=%.1f, nOBSat=%d, wsFlags=%08x\n",
                      j, sWBI.pSrc->pTab->zName,
                      sWBI.cost.rCost, sWBI.cost.plan.nRow,
                      sWBI.cost.plan.nOBSat, sWBI.cost.plan.wsFlags));
          bestPlan = sWBI.cost;
          bestJ = j;
        }

        /* In a join like "w JOIN x LEFT JOIN y JOIN z"  make sure that
        ** table y (and not table z) is always the next inner loop inside
        ** of table x. */
        if( (sWBI.pSrc->jointype & JT_LEFT)!=0 ) break;
      }
    }
    assert( bestJ>=0 );
    assert( sWBI.notValid & getMask(pMaskSet, pTabList->a[bestJ].iCursor) );
    assert( bestJ==iFrom || (pTabList->a[iFrom].jointype & JT_LEFT)==0 );
    testcase( bestJ>iFrom && (pTabList->a[iFrom].jointype & JT_CROSS)!=0 );
    testcase( bestJ>iFrom && bestJ<nTabList-1
                          && (pTabList->a[bestJ+1].jointype & JT_LEFT)!=0 );
    WHERETRACE(("*** Optimizer selects table %d (%s) for loop %d with:\n"
                "    cost=%.1f, nRow=%.1f, nOBSat=%d, wsFlags=0x%08x\n",
                bestJ, pTabList->a[bestJ].pTab->zName,
                pLevel-pWInfo->a, bestPlan.rCost, bestPlan.plan.nRow,
                bestPlan.plan.nOBSat, bestPlan.plan.wsFlags));
    if( (bestPlan.plan.wsFlags & WHERE_DISTINCT)!=0 ){
      assert( pWInfo->eDistinct==0 );
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
    andFlags &= bestPlan.plan.wsFlags;
    pLevel->plan = bestPlan.plan;
    pLevel->iTabCur = pTabList->a[bestJ].iCursor;
    testcase( bestPlan.plan.wsFlags & WHERE_INDEXED );
    testcase( bestPlan.plan.wsFlags & WHERE_TEMP_INDEX );
    if( bestPlan.plan.wsFlags & (WHERE_INDEXED|WHERE_TEMP_INDEX) ){
      if( (wctrlFlags & WHERE_ONETABLE_ONLY) 
       && (bestPlan.plan.wsFlags & WHERE_TEMP_INDEX)==0 
      ){
        pLevel->iIdxCur = iIdxCur;
      }else{
        pLevel->iIdxCur = pParse->nTab++;
      }
    }else{
      pLevel->iIdxCur = -1;
    }
    sWBI.notValid &= ~getMask(pMaskSet, pTabList->a[bestJ].iCursor);
    pLevel->iFrom = (u8)bestJ;
    if( bestPlan.plan.nRow>=(double)1 ){
      pParse->nQueryLoop *= bestPlan.plan.nRow;
    }

    /* Check that if the table scanned by this loop iteration had an
    ** INDEXED BY clause attached to it, that the named index is being
    ** used for the scan. If not, then query compilation has failed.
    ** Return an error.
    */
    pIdx = pTabList->a[bestJ].pIndex;
    if( pIdx ){
      if( (bestPlan.plan.wsFlags & WHERE_INDEXED)==0 ){
        sqlite3ErrorMsg(pParse, "cannot use index: %s", pIdx->zName);
        goto whereBeginError;
      }else{
        /* If an INDEXED BY clause is used, the bestIndex() function is
        ** guaranteed to find the index specified in the INDEXED BY clause
        ** if it find an index at all. */
        assert( bestPlan.plan.u.pIdx==pIdx );
      }
    }
  }
  WHERETRACE(("*** Optimizer Finished ***\n"));
  if( pParse->nErr || db->mallocFailed ){
    goto whereBeginError;
  }
  if( nTabList ){
    pLevel--;
    pWInfo->nOBSat = pLevel->plan.nOBSat;
  }else{
    pWInfo->nOBSat = 0;
  }

  /* If the total query only selects a single row, then the ORDER BY
  ** clause is irrelevant.
  */
  if( (andFlags & WHERE_UNIQUE)!=0 && pOrderBy ){
    assert( nTabList==0 || (pLevel->plan.wsFlags & WHERE_ALL_UNIQUE)!=0 );
    pWInfo->nOBSat = pOrderBy->nExpr;
  }

  /* If the caller is an UPDATE or DELETE statement that is requesting
  ** to use a one-pass algorithm, determine if this is appropriate.
  ** The one-pass algorithm only works if the WHERE clause constraints
  ** the statement to update a single row.
  */
  assert( (wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || pWInfo->nLevel==1 );
  if( (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 && (andFlags & WHERE_UNIQUE)!=0 ){
    pWInfo->okOnePass = 1;
    pWInfo->a[0].plan.wsFlags &= ~WHERE_IDX_ONLY;
  }

  /* Open all tables in the pTabList and any indices selected for
  ** searching those tables.
  */
  sqlite3CodeVerifySchema(pParse, -1); /* Insert the cookie verifier Goto */
  notReady = ~(Bitmask)0;
  pWInfo->nRowOut = (double)1;
  for(ii=0, pLevel=pWInfo->a; ii<nTabList; ii++, pLevel++){
    Table *pTab;     /* Table to open */
    int iDb;         /* Index of database containing table/index */
    struct SrcList_item *pTabItem;

    pTabItem = &pTabList->a[pLevel->iFrom];
    pTab = pTabItem->pTab;
    pWInfo->nRowOut *= pLevel->plan.nRow;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    if( (pTab->tabFlags & TF_Ephemeral)!=0 || pTab->pSelect ){
      /* Do nothing */
    }else
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( (pLevel->plan.wsFlags & WHERE_VIRTUALTABLE)!=0 ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      int iCur = pTabItem->iCursor;
      sqlite3VdbeAddOp4(v, OP_VOpen, iCur, 0, 0, pVTab, P4_VTAB);
    }else if( IsVirtual(pTab) ){
      /* noop */
    }else
#endif
    if( (pLevel->plan.wsFlags & WHERE_IDX_ONLY)==0
         && (wctrlFlags & WHERE_OMIT_OPEN_CLOSE)==0 ){
      int op = pWInfo->okOnePass ? OP_OpenWrite : OP_OpenRead;
      sqlite3OpenTable(pParse, pTabItem->iCursor, iDb, pTab, op);
      testcase( pTab->nCol==BMS-1 );
      testcase( pTab->nCol==BMS );
      if( !pWInfo->okOnePass && pTab->nCol<BMS ){
        Bitmask b = pTabItem->colUsed;
        int n = 0;
        for(; b; b=b>>1, n++){}
        sqlite3VdbeChangeP4(v, sqlite3VdbeCurrentAddr(v)-1, 
                            SQLITE_INT_TO_PTR(n), P4_INT32);
        assert( n<=pTab->nCol );
      }
    }else{
      sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
    }
#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
    if( (pLevel->plan.wsFlags & WHERE_TEMP_INDEX)!=0 ){
      constructAutomaticIndex(pParse, sWBI.pWC, pTabItem, notReady, pLevel);
    }else
#endif
    if( (pLevel->plan.wsFlags & WHERE_INDEXED)!=0 ){
      Index *pIx = pLevel->plan.u.pIdx;
      KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIx);
      int iIndexCur = pLevel->iIdxCur;
      assert( pIx->pSchema==pTab->pSchema );
      assert( iIndexCur>=0 );
      sqlite3VdbeAddOp4(v, OP_OpenRead, iIndexCur, pIx->tnum, iDb,
                        (char*)pKey, P4_KEYINFO_HANDOFF);
      VdbeComment((v, "%s", pIx->zName));
    }
    sqlite3CodeVerifySchema(pParse, iDb);
    notReady &= ~getMask(sWBI.pWC->pMaskSet, pTabItem->iCursor);
  }
  pWInfo->iTop = sqlite3VdbeCurrentAddr(v);
  if( db->mallocFailed ) goto whereBeginError;

  /* Generate the code to do the search.  Each iteration of the for
  ** loop below generates code for a single nested loop of the VM
  ** program.
  */
  notReady = ~(Bitmask)0;
  for(ii=0; ii<nTabList; ii++){
    pLevel = &pWInfo->a[ii];
    explainOneScan(pParse, pTabList, pLevel, ii, pLevel->iFrom, wctrlFlags);
    notReady = codeOneLoopStart(pWInfo, ii, wctrlFlags, notReady);
    pWInfo->iContinue = pLevel->addrCont;
  }

#ifdef SQLITE_TEST  /* For testing and debugging use only */
  /* Record in the query plan information about the current table
  ** and the index used to access it (if any).  If the table itself
  ** is not used, its name is just '{}'.  If no index is used
  ** the index is listed as "{}".  If the primary key is used the
  ** index name is '*'.
  */
  for(ii=0; ii<nTabList; ii++){
    char *z;
    int n;
    int w;
    struct SrcList_item *pTabItem;

    pLevel = &pWInfo->a[ii];
    w = pLevel->plan.wsFlags;
    pTabItem = &pTabList->a[pLevel->iFrom];
    z = pTabItem->zAlias;
    if( z==0 ) z = pTabItem->pTab->zName;
    n = sqlite3Strlen30(z);
    if( n+nQPlan < sizeof(sqlite3_query_plan)-10 ){
      if( (w & WHERE_IDX_ONLY)!=0 && (w & WHERE_COVER_SCAN)==0 ){
        memcpy(&sqlite3_query_plan[nQPlan], "{}", 2);
        nQPlan += 2;
      }else{
        memcpy(&sqlite3_query_plan[nQPlan], z, n);
        nQPlan += n;
      }
      sqlite3_query_plan[nQPlan++] = ' ';
    }
    testcase( w & WHERE_ROWID_EQ );
    testcase( w & WHERE_ROWID_RANGE );
    if( w & (WHERE_ROWID_EQ|WHERE_ROWID_RANGE) ){
      memcpy(&sqlite3_query_plan[nQPlan], "* ", 2);
      nQPlan += 2;
    }else if( (w & WHERE_INDEXED)!=0 && (w & WHERE_COVER_SCAN)==0 ){
      n = sqlite3Strlen30(pLevel->plan.u.pIdx->zName);
      if( n+nQPlan < sizeof(sqlite3_query_plan)-2 ){
        memcpy(&sqlite3_query_plan[nQPlan], pLevel->plan.u.pIdx->zName, n);
        nQPlan += n;
        sqlite3_query_plan[nQPlan++] = ' ';
      }
    }else{
      memcpy(&sqlite3_query_plan[nQPlan], "{} ", 3);
      nQPlan += 3;
    }
  }
  while( nQPlan>0 && sqlite3_query_plan[nQPlan-1]==' ' ){
    sqlite3_query_plan[--nQPlan] = 0;
  }
  sqlite3_query_plan[nQPlan] = 0;
  nQPlan = 0;
#endif /* SQLITE_TEST // Testing and debugging use only */

  /* Record the continuation address in the WhereInfo structure.  Then
  ** clean up and return.
  */
  return pWInfo;

  /* Jump here if malloc fails */
whereBeginError:
  if( pWInfo ){
    pParse->nQueryLoop = pWInfo->savedNQueryLoop;
    whereInfoFree(db, pWInfo);
  }
  return 0;
}